

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_trace_diag_sse2_128_64.c
# Opt level: O3

parasail_result_t *
parasail_sw_trace_diag_sse2_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  undefined4 uVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  parasail_result_t *ppVar8;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  uint uVar9;
  int iVar10;
  ulong uVar12;
  bool bVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  int iVar28;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar29;
  ulong uVar30;
  int iVar41;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  __m128i_64_t A_1;
  ulong uVar50;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  __m128i_64_t B_4;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  __m128i_64_t A;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  int iVar73;
  ulong uVar74;
  ulong uVar78;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int iVar87;
  long lVar88;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar96;
  int iVar97;
  int iVar98;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  long lVar95;
  __m128i_64_t B_2;
  __m128i_64_t B_1;
  undefined1 auVar99 [16];
  ulong uVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  ulong uStack_190;
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  uint local_168;
  int iStack_164;
  long local_158;
  long local_150;
  undefined1 local_148 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  char *local_e8;
  long lStack_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  long local_b0;
  long local_a8;
  ulong local_a0;
  undefined1 local_98 [16];
  long local_88;
  undefined8 uStack_80;
  ulong local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  int local_48;
  undefined4 uStack_44;
  int iStack_40;
  undefined4 uStack_3c;
  int64_t iVar11;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_trace_diag_sse2_128_64_cold_7();
  }
  else {
    uVar19 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_sw_trace_diag_sse2_128_64_cold_6();
    }
    else if (open < 0) {
      parasail_sw_trace_diag_sse2_128_64_cold_5();
    }
    else if (gap < 0) {
      parasail_sw_trace_diag_sse2_128_64_cold_4();
    }
    else {
      uVar14 = (ulong)(uint)_s1Len;
      if (matrix == (parasail_matrix_t *)0x0) {
        parasail_sw_trace_diag_sse2_128_64_cold_3();
      }
      else {
        if (matrix->type == 0) {
          if (_s1 == (char *)0x0) {
            parasail_sw_trace_diag_sse2_128_64_cold_2();
            return (parasail_result_t *)0x0;
          }
          if (_s1Len < 1) {
            parasail_sw_trace_diag_sse2_128_64_cold_1();
            return (parasail_result_t *)0x0;
          }
        }
        else {
          uVar14 = (ulong)(uint)matrix->length;
        }
        iVar7 = matrix->min;
        uVar18 = 0x8000000000000000 - (long)iVar7;
        if (iVar7 != -open && SBORROW4(iVar7,-open) == iVar7 + open < 0) {
          uVar18 = (ulong)(uint)open | 0x8000000000000000;
        }
        lVar16 = uVar18 + 1;
        local_d8._8_8_ = local_d8._0_8_;
        local_d8._0_8_ = (long)matrix->max;
        auVar40._8_4_ = (int)lVar16;
        auVar40._0_8_ = lVar16;
        auVar40._12_4_ = (int)((ulong)lVar16 >> 0x20);
        iVar7 = (int)uVar14;
        local_128 = auVar40;
        local_e8 = _s1;
        local_c8 = auVar40;
        local_98 = auVar40;
        ppVar8 = parasail_result_new_trace(iVar7,s2Len,0x10,1);
        if (ppVar8 != (parasail_result_t *)0x0) {
          local_f8._0_4_ = gap;
          ppVar8->flag = ppVar8->flag | 0x2881004;
          uVar12 = (ulong)(s2Len + 2);
          ptr = parasail_memalign_int64_t(0x10,uVar12);
          ptr_00 = parasail_memalign_int64_t(0x10,uVar12);
          ptr_01 = parasail_memalign_int64_t(0x10,uVar12);
          if (ptr_01 != (int64_t *)0x0 && (ptr_00 != (int64_t *)0x0 && ptr != (int64_t *)0x0)) {
            lVar15 = (long)iVar7;
            if (matrix->type == 0) {
              ptr_02 = parasail_memalign_int64_t(0x10,(long)(iVar7 + 1));
              if (ptr_02 == (int64_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              if (0 < iVar7) {
                piVar1 = matrix->mapper;
                lVar88 = 0;
                do {
                  ptr_02[lVar88] = (long)piVar1[(byte)local_e8[lVar88]];
                  lVar88 = lVar88 + 1;
                } while (lVar15 != lVar88);
              }
              ptr_02[lVar15] = 0;
            }
            else {
              ptr_02 = (int64_t *)0x0;
            }
            local_88 = 0x7ffffffffffffffe - local_d8._0_8_;
            uStack_80 = 0;
            uVar20 = (uint)local_88;
            iVar28 = (int)((ulong)local_88 >> 0x20);
            local_118._8_4_ = uVar20;
            local_118._0_8_ = local_88;
            local_118._12_4_ = iVar28;
            uStack_190 = auVar40._8_8_;
            local_78 = uStack_190;
            uStack_70 = 0;
            local_48 = open;
            uStack_44 = 0;
            iStack_40 = open;
            uStack_3c = 0;
            uVar4 = local_f8._0_4_;
            local_58._0_8_ = CONCAT44(0,local_f8._0_4_);
            local_58._8_4_ = local_f8._0_4_;
            local_58._12_4_ = 0;
            auVar5 = local_58;
            piVar1 = matrix->mapper;
            uVar12 = 0;
            do {
              ptr[uVar12 + 1] = (long)piVar1[(byte)_s2[uVar12]];
              uVar12 = uVar12 + 1;
            } while (uVar19 != uVar12);
            uVar12 = 0;
            *ptr = 0;
            ptr[uVar19 + 1] = 0;
            do {
              ptr_00[uVar12 + 1] = 0;
              ptr_01[uVar12 + 1] = lVar16;
              uVar12 = uVar12 + 1;
            } while (uVar19 != uVar12);
            *ptr_00 = lVar16;
            *ptr_01 = lVar16;
            ptr_00[uVar19 + 1] = lVar16;
            local_b0 = lVar16;
            ptr_01[uVar19 + 1] = lVar16;
            auVar26 = _DAT_00904920;
            local_98 = auVar40;
            local_c8 = auVar40;
            local_128 = auVar40;
            local_148 = auVar40;
            if (0 < iVar7) {
              auVar21._8_4_ = iVar7;
              auVar21._0_8_ = uVar14;
              auVar21._12_4_ = 0;
              local_a8 = uVar19 * 2;
              local_150 = uVar19 - 1;
              local_108._0_12_ = ZEXT812(1);
              local_108._12_4_ = 0;
              local_158 = 0;
              local_68 = auVar21 ^ _DAT_00904920;
              auVar21 = local_68;
              uVar14 = 0;
              do {
                if (matrix->type == 0) {
                  uVar12 = ptr_02[uVar14];
                  iVar11 = ptr_02[uVar14 + 1];
                }
                else {
                  uVar9 = (uint)uVar14 | 1;
                  if (lVar15 <= (long)(uVar14 | 1)) {
                    uVar9 = iVar7 - 1;
                  }
                  iVar11 = (int64_t)(int)uVar9;
                  uVar12 = uVar14;
                }
                piVar1 = matrix->matrix;
                iVar10 = matrix->size;
                local_a0 = uVar14;
                uVar17 = 0;
                lVar88 = -1;
                lVar95 = 0;
                auVar31._8_8_ = 0;
                auVar31._0_8_ = uStack_190;
                auVar53 = auVar40;
                auVar75 = auVar31;
                auVar44 = auVar40;
                do {
                  local_178 = (int)lVar88;
                  iStack_174 = (int)((ulong)lVar88 >> 0x20);
                  iStack_170 = (int)lVar95;
                  iStack_16c = (int)((ulong)lVar95 >> 0x20);
                  local_d8 = local_c8;
                  uVar74 = (long)piVar1[iVar11 * iVar10 + ptr[uVar17]] + auVar31._0_8_;
                  uVar78 = (long)piVar1[uVar12 * (long)iVar10 + ptr[uVar17 + 1]] + auVar31._8_8_;
                  local_e8 = auVar75._8_8_;
                  lStack_e0 = ptr_00[uVar17 + 1];
                  auVar61._0_8_ = (long)local_e8 - (ulong)(uint)open;
                  auVar61._8_8_ = lStack_e0 - (ulong)(uint)open;
                  local_58._12_4_ = 0;
                  local_58._8_4_ = uVar4;
                  auVar71._0_8_ = auVar53._8_8_ - local_58._0_8_;
                  auVar71._8_8_ = ptr_01[uVar17 + 1] - local_58._8_8_;
                  auVar22._0_8_ = auVar75._0_8_ - (ulong)(uint)open;
                  auVar22._8_8_ = (long)local_e8 - (ulong)(uint)open;
                  auVar99._0_8_ = auVar44._0_8_ - local_58._0_8_;
                  auVar99._8_8_ = auVar44._8_8_ - local_58._8_8_;
                  auVar31 = auVar71 ^ auVar26;
                  auVar53 = auVar61 ^ auVar26;
                  auVar58._0_4_ = -(uint)(auVar31._0_4_ < auVar53._0_4_);
                  auVar58._4_4_ = -(uint)(auVar31._4_4_ < auVar53._4_4_);
                  auVar58._8_4_ = -(uint)(auVar31._8_4_ < auVar53._8_4_);
                  auVar58._12_4_ = -(uint)(auVar31._12_4_ < auVar53._12_4_);
                  auVar70._4_4_ = auVar58._0_4_;
                  auVar70._0_4_ = auVar58._0_4_;
                  auVar70._8_4_ = auVar58._8_4_;
                  auVar70._12_4_ = auVar58._8_4_;
                  auVar54._4_4_ = -(uint)(auVar53._4_4_ == auVar31._4_4_);
                  auVar54._12_4_ = -(uint)(auVar53._12_4_ == auVar31._12_4_);
                  auVar54._0_4_ = auVar54._4_4_;
                  auVar54._8_4_ = auVar54._12_4_;
                  local_f8._4_4_ = auVar58._4_4_;
                  local_f8._0_4_ = auVar58._4_4_;
                  local_f8._8_4_ = auVar58._12_4_;
                  local_f8._12_4_ = auVar58._12_4_;
                  auVar31 = auVar70 & auVar54 | local_f8;
                  auVar71 = ~auVar31 & auVar71 | auVar61 & auVar31;
                  auVar62._8_8_ = 0;
                  auVar62._0_8_ = auVar99._0_8_;
                  uVar30 = auVar26._0_8_;
                  uVar100 = auVar26._8_8_;
                  uVar50 = uVar78 ^ uVar100;
                  auVar31 = auVar62 ^ auVar26;
                  iVar87 = -(uint)(auVar31._0_4_ < (int)(auVar22._0_8_ ^ uVar30));
                  iVar73 = (int)((auVar22._0_8_ ^ uVar30) >> 0x20);
                  iVar92 = -(uint)(auVar31._4_4_ < iVar73);
                  iVar97 = (int)(uVar50 >> 0x20);
                  iVar93 = -(uint)(auVar31._8_4_ < (int)uVar50);
                  iVar96 = -(uint)(auVar31._12_4_ < iVar97);
                  auVar79._4_4_ = -(uint)(auVar31._4_4_ == iVar73);
                  auVar79._12_4_ = -(uint)(auVar31._12_4_ == iVar97);
                  auVar42._4_4_ = iVar87;
                  auVar42._0_4_ = iVar87;
                  auVar42._8_4_ = iVar93;
                  auVar42._12_4_ = iVar93;
                  auVar79._0_4_ = auVar79._4_4_;
                  auVar79._8_4_ = auVar79._12_4_;
                  auVar43._4_4_ = iVar92;
                  auVar43._0_4_ = iVar92;
                  auVar43._8_4_ = iVar96;
                  auVar43._12_4_ = iVar96;
                  auVar43 = auVar43 | auVar79 & auVar42;
                  auVar44._0_8_ = auVar22._0_8_ & auVar43._0_8_;
                  auVar44._8_8_ = uVar78 & auVar43._8_8_;
                  auVar44 = ~auVar43 & auVar62 | auVar44;
                  uVar50 = uVar74 ^ uVar30;
                  iVar92 = -(uint)(auVar26._0_4_ < (int)uVar50);
                  iVar73 = (int)(uVar50 >> 0x20);
                  iVar93 = -(uint)(auVar26._4_4_ < iVar73);
                  iVar94 = (int)((auVar22._8_8_ ^ uVar100) >> 0x20);
                  iVar96 = -(uint)((int)(auVar99._8_8_ ^ uVar100) < (int)(auVar22._8_8_ ^ uVar100));
                  iVar87 = (int)((auVar99._8_8_ ^ uVar100) >> 0x20);
                  iVar97 = -(uint)(iVar87 < iVar94);
                  auVar80._4_4_ = -(uint)(auVar26._4_4_ == iVar73);
                  auVar80._12_4_ = -(uint)(iVar87 == iVar94);
                  auVar63._4_4_ = iVar92;
                  auVar63._0_4_ = iVar92;
                  auVar63._8_4_ = iVar96;
                  auVar63._12_4_ = iVar96;
                  auVar80._0_4_ = auVar80._4_4_;
                  auVar80._8_4_ = auVar80._12_4_;
                  auVar101._4_4_ = iVar93;
                  auVar101._0_4_ = iVar93;
                  auVar101._8_4_ = iVar97;
                  auVar101._12_4_ = iVar97;
                  auVar101 = auVar101 | auVar80 & auVar63;
                  auVar102._0_8_ = uVar74 & auVar101._0_8_;
                  uVar50 = auVar101._8_8_;
                  auVar102._8_8_ = auVar22._8_8_ & uVar50;
                  auVar53._8_8_ = 0;
                  auVar53._0_8_ = ~uVar50 & auVar99._8_8_;
                  auVar102 = auVar53 << 0x40 | auVar102;
                  auVar103._8_8_ = auVar102._8_8_;
                  uVar30 = auVar102._0_8_ ^ uVar30;
                  auVar31 = auVar44 ^ auVar26;
                  iVar73 = -(uint)((int)uVar30 < auVar31._0_4_);
                  iVar87 = (int)(uVar30 >> 0x20);
                  iVar93 = -(uint)(iVar87 < auVar31._4_4_);
                  iVar96 = -(uint)((int)(auVar103._8_8_ ^ uVar100) < auVar31._8_4_);
                  iVar92 = (int)((auVar103._8_8_ ^ uVar100) >> 0x20);
                  iVar97 = -(uint)(iVar92 < auVar31._12_4_);
                  auVar81._4_4_ = iVar73;
                  auVar81._0_4_ = iVar73;
                  auVar81._8_4_ = iVar96;
                  auVar81._12_4_ = iVar96;
                  iVar87 = -(uint)(auVar31._4_4_ == iVar87);
                  iVar92 = -(uint)(auVar31._12_4_ == iVar92);
                  auVar75._4_4_ = iVar87;
                  auVar75._0_4_ = iVar87;
                  auVar75._8_4_ = iVar92;
                  auVar75._12_4_ = iVar92;
                  auVar64._4_4_ = iVar93;
                  auVar64._0_4_ = iVar93;
                  auVar64._8_4_ = iVar97;
                  auVar64._12_4_ = iVar97;
                  auVar64 = auVar64 | auVar75 & auVar81;
                  auVar53 = ~auVar64 & auVar102 | auVar44 & auVar64;
                  auVar31 = auVar53 ^ auVar26;
                  auVar75 = auVar71 ^ auVar26;
                  iVar87 = -(uint)(auVar75._0_4_ < auVar31._0_4_);
                  auVar82._4_4_ = -(uint)(auVar75._4_4_ < auVar31._4_4_);
                  iVar92 = -(uint)(auVar75._8_4_ < auVar31._8_4_);
                  auVar82._12_4_ = -(uint)(auVar75._12_4_ < auVar31._12_4_);
                  auVar76._4_4_ = -(uint)(auVar75._4_4_ == auVar31._4_4_);
                  auVar76._12_4_ = -(uint)(auVar75._12_4_ == auVar31._12_4_);
                  auVar59._4_4_ = iVar87;
                  auVar59._0_4_ = iVar87;
                  auVar59._8_4_ = iVar92;
                  auVar59._12_4_ = iVar92;
                  auVar76._0_4_ = auVar76._4_4_;
                  auVar76._8_4_ = auVar76._12_4_;
                  auVar82._0_4_ = auVar82._4_4_;
                  auVar82._8_4_ = auVar82._12_4_;
                  auVar82 = auVar82 | auVar76 & auVar59;
                  auVar32._0_4_ = -(uint)(local_178 == -1);
                  auVar32._4_4_ = -(uint)(iStack_174 == -1);
                  auVar32._8_4_ = -(uint)(iStack_170 == -1);
                  auVar32._12_4_ = -(uint)(iStack_16c == -1);
                  auVar77._4_4_ = auVar32._0_4_;
                  auVar77._0_4_ = auVar32._4_4_;
                  auVar77._8_4_ = auVar32._12_4_;
                  auVar77._12_4_ = auVar32._8_4_;
                  auVar77 = auVar77 & auVar32;
                  auVar75 = ~auVar77 & (~auVar82 & auVar71 | auVar53 & auVar82);
                  auVar53 = ~auVar77 & auVar71 | auVar40 & auVar77;
                  auVar31 = auVar75 ^ auVar26;
                  iVar87 = auVar31._0_4_;
                  iVar92 = auVar31._4_4_;
                  iVar73 = auVar31._8_4_;
                  iVar93 = auVar31._12_4_;
                  if (1 < uVar17) {
                    auVar31 = local_118 ^ auVar26;
                    iVar96 = -(uint)(auVar31._0_4_ < iVar87);
                    iVar97 = -(uint)(auVar31._4_4_ < iVar92);
                    iVar94 = -(uint)(auVar31._8_4_ < iVar73);
                    iVar98 = -(uint)(auVar31._12_4_ < iVar93);
                    auVar65._4_4_ = iVar96;
                    auVar65._0_4_ = iVar96;
                    auVar65._8_4_ = iVar94;
                    auVar65._12_4_ = iVar94;
                    auVar83._4_4_ = -(uint)(auVar31._4_4_ == iVar92);
                    auVar83._12_4_ = -(uint)(auVar31._12_4_ == iVar93);
                    auVar83._0_4_ = auVar83._4_4_;
                    auVar83._8_4_ = auVar83._12_4_;
                    auVar66._4_4_ = iVar97;
                    auVar66._0_4_ = iVar97;
                    auVar66._8_4_ = iVar98;
                    auVar66._12_4_ = iVar98;
                    auVar66 = auVar66 | auVar83 & auVar65;
                    local_118 = local_118 & auVar66 | ~auVar66 & auVar75;
                    auVar31 = local_148 ^ auVar26;
                    iVar96 = -(uint)(iVar87 < auVar31._0_4_);
                    auVar84._4_4_ = -(uint)(iVar92 < auVar31._4_4_);
                    iVar97 = -(uint)(iVar73 < auVar31._8_4_);
                    auVar84._12_4_ = -(uint)(iVar93 < auVar31._12_4_);
                    auVar89._4_4_ = iVar96;
                    auVar89._0_4_ = iVar96;
                    auVar89._8_4_ = iVar97;
                    auVar89._12_4_ = iVar97;
                    auVar67._4_4_ = -(uint)(auVar31._4_4_ == iVar92);
                    auVar67._12_4_ = -(uint)(auVar31._12_4_ == iVar93);
                    auVar67._0_4_ = auVar67._4_4_;
                    auVar67._8_4_ = auVar67._12_4_;
                    auVar84._0_4_ = auVar84._4_4_;
                    auVar84._8_4_ = auVar84._12_4_;
                    auVar84 = auVar84 | auVar67 & auVar89;
                    local_148 = local_148 & auVar84 | ~auVar84 & auVar75;
                  }
                  iVar96 = auVar75._0_4_;
                  iVar97 = auVar75._4_4_;
                  iVar94 = auVar75._8_4_;
                  iVar98 = auVar75._12_4_;
                  auVar85._8_8_ = -(ulong)(auVar75._8_8_ == auVar44._8_8_);
                  auVar85._0_8_ = -(ulong)(auVar75._0_8_ == auVar102._0_8_);
                  auVar68._0_4_ = -(uint)(iVar96 == auVar53._0_4_);
                  auVar68._4_4_ = -(uint)(iVar97 == auVar53._4_4_);
                  auVar68._8_4_ = -(uint)(iVar94 == auVar53._8_4_);
                  auVar68._12_4_ = -(uint)(iVar98 == auVar53._12_4_);
                  auVar90._4_4_ = auVar68._0_4_;
                  auVar90._0_4_ = auVar68._4_4_;
                  auVar90._8_4_ = auVar68._12_4_;
                  auVar90._12_4_ = auVar68._8_4_;
                  auVar69._0_8_ = 1 - SUB168(auVar90 & auVar68,0);
                  auVar69._8_8_ = 1 - SUB168(auVar90 & auVar68,8);
                  auVar33._0_4_ = -(uint)(iVar96 == 0);
                  auVar33._4_4_ = -(uint)(iVar97 == 0);
                  auVar33._8_4_ = -(uint)(iVar94 == 0);
                  auVar33._12_4_ = -(uint)(iVar98 == 0);
                  auVar91._4_4_ = auVar33._0_4_;
                  auVar91._0_4_ = auVar33._4_4_;
                  auVar91._8_4_ = auVar33._12_4_;
                  auVar91._12_4_ = auVar33._8_4_;
                  auVar99 = auVar99 ^ auVar26;
                  auVar22 = auVar22 ^ auVar26;
                  auVar34._0_4_ = -(uint)(auVar99._0_4_ < auVar22._0_4_);
                  auVar34._4_4_ = -(uint)(auVar99._4_4_ < auVar22._4_4_);
                  auVar34._8_4_ = -(uint)(auVar99._8_4_ < auVar22._8_4_);
                  auVar34._12_4_ = -(uint)(auVar99._12_4_ < auVar22._12_4_);
                  auVar23._4_4_ = -(uint)(auVar22._4_4_ == auVar99._4_4_);
                  auVar23._12_4_ = -(uint)(auVar22._12_4_ == auVar99._12_4_);
                  auVar23._0_4_ = auVar23._4_4_;
                  auVar23._8_4_ = auVar23._12_4_;
                  auVar35._4_4_ = auVar34._4_4_;
                  auVar35._0_4_ = auVar34._4_4_;
                  auVar35._8_4_ = auVar34._12_4_;
                  auVar35._12_4_ = auVar34._12_4_;
                  auVar31 = ((auVar54 & auVar58 | local_f8) & _DAT_00906940 |
                             (auVar35 | auVar23 & auVar34) & _DAT_00906930 | ~auVar85 & auVar69 |
                            ~(auVar91 & auVar33) & auVar85 & _DAT_00903ab0) ^ _DAT_00906950;
                  piVar2 = ((ppVar8->field_4).rowcols)->score_row;
                  if (uVar17 < uVar19) {
                    *(char *)((long)piVar2 + uVar17 + local_158) = auVar31[8];
                  }
                  auVar103._0_8_ = auVar44._0_8_;
                  auVar86._8_4_ = 0xffffffff;
                  auVar86._0_8_ = 0xffffffffffffffff;
                  auVar86._12_4_ = 0xffffffff;
                  auVar3._8_4_ = iStack_170;
                  auVar3._0_8_ = lVar88;
                  auVar3._12_4_ = iStack_16c;
                  if (uVar17 != 0 && (long)(uVar14 | 1) < lVar15) {
                    *(char *)((long)piVar2 + uVar17 + local_150) = auVar31[0];
                  }
                  auVar44 = auVar40 & auVar77 | ~auVar77 & auVar103;
                  auVar31 = local_108 ^ auVar26;
                  iVar29 = -(uint)(auVar31._0_4_ < (int)local_68._0_4_);
                  auVar36._4_4_ = -(uint)(auVar31._4_4_ < (int)local_68._4_4_);
                  iVar41 = -(uint)(auVar31._8_4_ < (int)local_68._8_4_);
                  auVar36._12_4_ = -(uint)(auVar31._12_4_ < (int)local_68._12_4_);
                  auVar45._4_4_ = iVar29;
                  auVar45._0_4_ = iVar29;
                  auVar45._8_4_ = iVar41;
                  auVar45._12_4_ = iVar41;
                  auVar24._4_4_ = -(uint)(auVar31._4_4_ == local_68._4_4_);
                  auVar24._12_4_ = -(uint)(auVar31._12_4_ == local_68._12_4_);
                  auVar24._0_4_ = auVar24._4_4_;
                  auVar24._8_4_ = auVar24._12_4_;
                  auVar36._0_4_ = auVar36._4_4_;
                  auVar36._8_4_ = auVar36._12_4_;
                  auVar46._8_8_ = -(ulong)(auVar3._8_8_ < (long)uVar19);
                  auVar46._0_8_ = -(ulong)(lVar88 < (long)uVar19);
                  auVar25._0_4_ = -(uint)(-1 < lVar88);
                  auVar25._4_4_ = -(uint)(-1 < lVar88);
                  auVar25._8_4_ = -(uint)(-1 < lVar95);
                  auVar25._12_4_ = -(uint)(-1 < lVar95);
                  auVar25 = auVar25 & auVar46 & (auVar36 | auVar24 & auVar45);
                  auVar31 = local_98 ^ auVar26;
                  iVar87 = -(uint)(auVar31._0_4_ < iVar87);
                  auVar47._4_4_ = -(uint)(auVar31._4_4_ < iVar92);
                  iVar73 = -(uint)(auVar31._8_4_ < iVar73);
                  auVar47._12_4_ = -(uint)(auVar31._12_4_ < iVar93);
                  auVar55._4_4_ = iVar87;
                  auVar55._0_4_ = iVar87;
                  auVar55._8_4_ = iVar73;
                  auVar55._12_4_ = iVar73;
                  auVar37._4_4_ = -(uint)(auVar31._4_4_ == iVar92);
                  auVar37._12_4_ = -(uint)(auVar31._12_4_ == iVar93);
                  auVar37._0_4_ = auVar37._4_4_;
                  auVar37._8_4_ = auVar37._12_4_;
                  auVar47._0_4_ = auVar47._4_4_;
                  auVar47._8_4_ = auVar47._12_4_;
                  auVar31 = (auVar47 | auVar37 & auVar55) & auVar25;
                  auVar22 = auVar3 ^ auVar26;
                  auVar59 = local_c8 ^ auVar26;
                  iVar87 = -(uint)(auVar22._0_4_ < auVar59._0_4_);
                  iVar92 = -(uint)(auVar22._4_4_ < auVar59._4_4_);
                  iVar73 = -(uint)(auVar22._8_4_ < auVar59._8_4_);
                  iVar93 = -(uint)(auVar22._12_4_ < auVar59._12_4_);
                  auVar60._4_4_ = -(uint)(auVar59._4_4_ == auVar22._4_4_);
                  auVar60._12_4_ = -(uint)(auVar59._12_4_ == auVar22._12_4_);
                  auVar56._4_4_ = iVar87;
                  auVar56._0_4_ = iVar87;
                  auVar56._8_4_ = iVar73;
                  auVar56._12_4_ = iVar73;
                  auVar60._0_4_ = auVar60._4_4_;
                  auVar60._8_4_ = auVar60._12_4_;
                  auVar72._0_4_ = -(uint)(iVar96 == local_98._0_4_);
                  auVar72._4_4_ = -(uint)(iVar97 == local_98._4_4_);
                  auVar72._8_4_ = -(uint)(iVar94 == local_98._8_4_);
                  auVar72._12_4_ = -(uint)(iVar98 == local_98._12_4_);
                  auVar57._4_4_ = iVar92;
                  auVar57._0_4_ = iVar92;
                  auVar57._8_4_ = iVar93;
                  auVar57._12_4_ = iVar93;
                  local_98 = auVar31 & auVar75 | ~auVar31 & local_98;
                  auVar38._4_4_ = auVar72._0_4_;
                  auVar38._0_4_ = auVar72._4_4_;
                  auVar38._8_4_ = auVar72._12_4_;
                  auVar38._12_4_ = auVar72._8_4_;
                  auVar25 = (auVar57 | auVar60 & auVar56) & auVar72 & auVar38 & auVar25;
                  local_128 = auVar25 & local_108 |
                              ~auVar25 & (auVar31 & local_108 | ~auVar31 & local_128);
                  local_c8 = auVar25 & auVar3 | ~auVar25 & (auVar31 & auVar3 | ~auVar31 & local_c8);
                  ptr_00[uVar17] = auVar75._0_8_;
                  ptr_01[uVar17] = auVar53._0_8_;
                  lVar88 = lVar88 + 1;
                  lVar95 = auVar3._8_8_ - auVar86._8_8_;
                  uVar17 = uVar17 + 1;
                  auVar31._8_8_ = lStack_e0;
                  auVar31._0_8_ = local_e8;
                } while (s2Len + 1 != uVar17);
                local_108._8_8_ = local_108._8_8_ + 2;
                local_108._0_8_ = local_108._0_8_ + 2;
                uVar14 = uVar14 + 2;
                local_158 = local_158 + local_a8;
                local_150 = local_150 + local_a8;
                local_68 = auVar21;
              } while ((long)uVar14 < lVar15);
            }
            lVar15 = 0;
            iVar7 = 0;
            iVar10 = 0;
            local_168 = (uint)uVar18;
            iStack_164 = (int)(uVar18 >> 0x20);
            bVar6 = true;
            do {
              bVar13 = bVar6;
              lVar88 = *(long *)(local_98 + lVar15);
              if (lVar16 < lVar88) {
                iVar7 = *(int *)(local_128 + lVar15);
                lVar16 = lVar88;
                iVar10 = *(int *)(local_c8 + lVar15);
              }
              else if (lVar88 == lVar16) {
                lVar88 = *(long *)(local_c8 + lVar15);
                if (lVar88 < iVar10) {
                  iVar7 = *(int *)(local_128 + lVar15);
                  iVar10 = (int)lVar88;
                }
                else if ((lVar88 == iVar10) && (*(long *)(local_128 + lVar15) < (long)iVar7)) {
                  iVar7 = (int)*(long *)(local_128 + lVar15);
                  iVar10 = (int)lVar88;
                }
              }
              lVar15 = lVar15 + 8;
              bVar6 = false;
            } while (bVar13);
            iVar87 = -(uint)((int)(local_168 ^ 0x80000000) < (int)(local_118._0_4_ ^ 0x80000000));
            auVar48._4_4_ = -(uint)(iStack_164 < (int)local_118._4_4_);
            iVar92 = -(uint)((int)(local_168 ^ 0x80000000) < (int)(local_118._8_4_ ^ 0x80000000));
            auVar48._12_4_ = -(uint)(iStack_164 < (int)local_118._12_4_);
            auVar51._4_4_ = iVar87;
            auVar51._0_4_ = iVar87;
            auVar51._8_4_ = iVar92;
            auVar51._12_4_ = iVar92;
            auVar26._4_4_ = -(uint)(iStack_164 == local_118._4_4_);
            auVar26._12_4_ = -(uint)(iStack_164 == local_118._12_4_);
            auVar26._0_4_ = auVar26._4_4_;
            auVar26._8_4_ = auVar26._12_4_;
            auVar48._0_4_ = auVar48._4_4_;
            auVar48._8_4_ = auVar48._12_4_;
            auVar27._8_4_ = 0xffffffff;
            auVar27._0_8_ = 0xffffffffffffffff;
            auVar27._12_4_ = 0xffffffff;
            iVar87 = -(uint)((int)(uVar20 ^ 0x80000000) < (int)(local_148._0_4_ ^ 0x80000000));
            auVar39._4_4_ = -(uint)(iVar28 < (int)local_148._4_4_);
            iVar92 = -(uint)((int)(uVar20 ^ 0x80000000) < (int)(local_148._8_4_ ^ 0x80000000));
            auVar39._12_4_ = -(uint)(iVar28 < (int)local_148._12_4_);
            auVar52._4_4_ = iVar87;
            auVar52._0_4_ = iVar87;
            auVar52._8_4_ = iVar92;
            auVar52._12_4_ = iVar92;
            auVar49._4_4_ = -(uint)(iVar28 == local_148._4_4_);
            auVar49._12_4_ = -(uint)(iVar28 == local_148._12_4_);
            auVar49._0_4_ = auVar49._4_4_;
            auVar49._8_4_ = auVar49._12_4_;
            auVar39._0_4_ = auVar39._4_4_;
            auVar39._8_4_ = auVar39._12_4_;
            auVar40 = auVar39 | auVar49 & auVar52 | auVar27 ^ (auVar48 | auVar26 & auVar51);
            if ((((((((((((((((auVar40 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar40 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar40 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar40 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar40 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar40 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar40 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar40 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar40 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar40 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar40 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar40 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar40 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar40 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar40 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar40[0xf] < '\0') {
              *(byte *)&ppVar8->flag = (byte)ppVar8->flag | 0x40;
              lVar16 = 0;
              iVar10 = 0;
              iVar7 = 0;
            }
            ppVar8->score = (int)lVar16;
            ppVar8->end_query = iVar7;
            ppVar8->end_ref = iVar10;
            local_58 = auVar5;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(ptr_02);
              return ppVar8;
            }
            return ppVar8;
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;
    __m128i vTDiag;
    __m128i vTIns;
    __m128i vTDel;
    __m128i vTZero;
    __m128i vTDiagE;
    __m128i vTInsE;
    __m128i vTDiagF;
    __m128i vTDelF;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }
        
    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);
    vTDiag = _mm_set1_epi64x_rpl(PARASAIL_DIAG);
    vTIns = _mm_set1_epi64x_rpl(PARASAIL_INS);
    vTDel = _mm_set1_epi64x_rpl(PARASAIL_DEL);
    vTZero = _mm_set1_epi64x_rpl(PARASAIL_ZERO);
    vTDiagE = _mm_set1_epi64x_rpl(PARASAIL_DIAG_E);
    vTInsE = _mm_set1_epi64x_rpl(PARASAIL_INS_E);
    vTDiagF = _mm_set1_epi64x_rpl(PARASAIL_DIAG_F);
    vTDelF = _mm_set1_epi64x_rpl(PARASAIL_DEL_F);

    /* initialize result */
    result = parasail_result_new_trace(s1Len, s2Len, 16, sizeof(int8_t));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vF = vNegInf;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vF_opn = _mm_sub_epi64(vNH, vOpen);
            vF_ext = _mm_sub_epi64(vF, vGap);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            vE_opn = _mm_sub_epi64(vWH, vOpen);
            vE_ext = _mm_sub_epi64(vE, vGap);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vNWH = _mm_max_epi64_rpl(vNWH, vZero);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64_rpl(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
            /* trace table */
            {
                __m128i cond_zero = _mm_cmpeq_epi64_rpl(vWH, vZero);
                __m128i case1 = _mm_cmpeq_epi64_rpl(vWH, vNWH);
                __m128i case2 = _mm_cmpeq_epi64_rpl(vWH, vF);
                __m128i vT = _mm_blendv_epi8_rpl(
                        _mm_blendv_epi8_rpl(vTIns, vTDel, case2),
                        _mm_blendv_epi8_rpl(vTDiag, vTZero, cond_zero),
                        case1);
                __m128i condE = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
                __m128i condF = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
                __m128i vET = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, condE);
                __m128i vFT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, condF);
                vT = _mm_or_si128(vT, vET);
                vT = _mm_or_si128(vT, vFT);
                arr_store_si128(result->trace->trace_table, vT, i, s1Len, j, s2Len);
            }
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi64_rpl(vJ, vNegOne),
                        _mm_cmplt_epi64_rpl(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi64_rpl(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi64_rpl(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8_rpl(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}